

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converters.cpp
# Opt level: O0

converters * __thiscall
pobr::imgProcessing::utils::converters::grayscaleImage(converters *this,Mat *img)

{
  Mat *img_00;
  anon_class_16_2_d9d6b42c local_50;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> local_40;
  undefined1 local_19;
  Mat *local_18;
  Mat *img_local;
  Mat *resultImg;
  
  local_19 = 0;
  local_18 = img;
  img_local = (Mat *)this;
  cv::Mat::clone();
  img_00 = local_18;
  local_50.img = local_18;
  local_50.resultImg = (Mat *)this;
  std::function<void(unsigned_long_const&,unsigned_long_const&)>::
  function<pobr::imgProcessing::utils::converters::grayscaleImage(cv::Mat_const&)::__0,void>
            ((function<void(unsigned_long_const&,unsigned_long_const&)> *)&local_40,&local_50);
  matrixOps::forEachPixel(img_00,&local_40);
  std::function<void_(const_unsigned_long_&,_const_unsigned_long_&)>::~function(&local_40);
  return this;
}

Assistant:

cv::Mat
converters::grayscaleImage(const cv::Mat& img)
{
    auto resultImg = img.clone();

    matrixOps::forEachPixel(
        img,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            auto& thisPixel = img.at<cv::Vec3b>(y, x);

            uint8_t value = (thisPixel[0] + thisPixel[1] + thisPixel[2]) / 3;

            resultImg.at<cv::Vec3b>(y, x)[0] = value;
            resultImg.at<cv::Vec3b>(y, x)[1] = value;
            resultImg.at<cv::Vec3b>(y, x)[2] = value;
        }
    );

    return resultImg;
}